

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evp.c
# Opt level: O0

void INT_EVassoc_conversion_action
               (CManager_conflict cm,int stone_id,int stage,FMFormat target_format,
               FMFormat incoming_format)

{
  int iVar1;
  undefined8 uVar2;
  FILE *out;
  event_path_data evp;
  response_cache_element *prVar3;
  FFSContext p_Var4;
  FFSTypeHandle p_Var5;
  FMFormat in_RCX;
  long in_RDI;
  CManager in_R8;
  char *incoming_tmp;
  char *target_tmp;
  char *server_id;
  FFSTypeHandle format;
  int id_len;
  int a;
  stone_type stone;
  response_cache_element *act;
  event_path_data in_stack_ffffffffffffff98;
  void *in_stack_ffffffffffffffa0;
  undefined1 local_38 [4];
  uint local_34;
  stone_type local_30;
  undefined8 in_stack_ffffffffffffffd8;
  CMTraceType trace_type;
  
  trace_type = (CMTraceType)((ulong)in_stack_ffffffffffffffd8 >> 0x20);
  local_30 = stone_struct(in_stack_ffffffffffffff98,0);
  if (local_30 != (stone_type)0x0) {
    local_34 = local_30->response_cache_count;
    uVar2 = get_server_ID_FMformat(in_R8,local_38);
    iVar1 = CMtrace_val[10];
    if (*(long *)(in_RDI + 0x120) == 0) {
      iVar1 = CMtrace_init(in_R8,trace_type);
    }
    if (iVar1 != 0) {
      out = (FILE *)global_name_of_FMFormat(in_RCX);
      evp = (event_path_data)global_name_of_FMFormat(in_R8);
      fprintf(*(FILE **)(in_RDI + 0x120),"Adding Conversion action %d to ",(ulong)local_34);
      fprint_stone_identifier(out,evp,(int)((ulong)in_stack_ffffffffffffffa0 >> 0x20));
      fprintf(*(FILE **)(in_RDI + 0x120),"\n   Incoming format is %s, target %s\n",evp,out);
    }
    prVar3 = (response_cache_element *)
             INT_CMrealloc(in_stack_ffffffffffffffa0,(size_t)in_stack_ffffffffffffff98);
    local_30->response_cache = prVar3;
    prVar3 = local_30->response_cache + (int)local_34;
    memset(prVar3,0,0x30);
    prVar3->requires_decoded = 0;
    prVar3->action_type = Action_Decode;
    prVar3->reference_format = (FMFormat)in_R8;
    prVar3->stage = Immediate;
    p_Var4 = (FFSContext)create_FFSContext_FM(*(undefined8 *)(*(long *)(in_RDI + 0x118) + 0x48));
    (prVar3->o).decode.context = p_Var4;
    p_Var5 = (FFSTypeHandle)FFSTypeHandle_from_encode((prVar3->o).decode.context,uVar2);
    (prVar3->o).decode.decode_format = p_Var5;
    (prVar3->o).decode.target_reference_format = in_RCX;
    p_Var4 = (prVar3->o).decode.context;
    uVar2 = format_list_of_FMFormat((prVar3->o).decode.target_reference_format);
    establish_conversion(p_Var4,p_Var5,uVar2);
    local_30->response_cache_count = local_30->response_cache_count + 1;
  }
  return;
}

Assistant:

extern void
INT_EVassoc_conversion_action(CManager cm, int stone_id, int stage, 
			      FMFormat target_format, FMFormat incoming_format)
{
    response_cache_element *act;
    stone_type stone;
    int a;
    int id_len;
    FFSTypeHandle format;
    char *server_id;

    stone = stone_struct(cm->evp, stone_id);
    if (!stone) return;

    a = stone->response_cache_count;
    server_id = get_server_ID_FMformat(incoming_format, &id_len);

    if (CMtrace_on(cm, EVerbose)) {
	char *target_tmp = global_name_of_FMFormat(target_format);
	char *incoming_tmp = global_name_of_FMFormat(incoming_format);
	fprintf(cm->CMTrace_file, "Adding Conversion action %d to ", a);
	fprint_stone_identifier(cm->CMTrace_file, cm->evp, stone_id);
	fprintf(cm->CMTrace_file, "\n   Incoming format is %s, target %s\n", incoming_tmp, 
	       target_tmp);
    }
    stone->response_cache = realloc(stone->response_cache,
			     sizeof(stone->response_cache[0]) * (a + 1));
    act = & stone->response_cache[a];
    memset(act, 0, sizeof(*act));
    act->requires_decoded = 0;
    act->action_type = Action_Decode;
    act->reference_format = incoming_format;
    act->stage = Immediate;

    act->o.decode.context = create_FFSContext_FM(cm->evp->fmc);
    format = FFSTypeHandle_from_encode(act->o.decode.context, 
				      server_id);
    act->o.decode.decode_format = format;
    act->o.decode.target_reference_format = target_format;
    establish_conversion(act->o.decode.context, format,
			 format_list_of_FMFormat(act->o.decode.target_reference_format));
    stone->response_cache_count++;
}